

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O0

boolean fill_mem_input_buffer(j_decompress_ptr cinfo)

{
  j_decompress_ptr cinfo_local;
  
  cinfo->err->msg_code = 0x7b;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
  cinfo->src->next_input_byte = fill_mem_input_buffer::mybuffer;
  cinfo->src->bytes_in_buffer = 2;
  return 1;
}

Assistant:

METHODDEF(boolean)
fill_mem_input_buffer (j_decompress_ptr cinfo)
{
  static const JOCTET mybuffer[4] = {
    (JOCTET) 0xFF, (JOCTET) JPEG_EOI, 0, 0
  };

  /* The whole JPEG data is expected to reside in the supplied memory
   * buffer, so any request for more data beyond the given buffer size
   * is treated as an error.
   */
  WARNMS(cinfo, JWRN_JPEG_EOF);

  /* Insert a fake EOI marker */

  cinfo->src->next_input_byte = mybuffer;
  cinfo->src->bytes_in_buffer = 2;

  return TRUE;
}